

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_unittests.cpp
# Opt level: O2

void __thiscall Matrix_Add_Test::TestBody(Matrix_Add_Test *this)

{
  int *piVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  Matrix<int> s;
  Matrix<int> c;
  Matrix<int> s2;
  Matrix<int> m;
  
  Matrix<int>::Matrix(&m,2,3);
  piVar1 = *m.M;
  piVar1[0] = 1;
  piVar1[1] = 2;
  piVar1 = m.M[1];
  piVar1[0] = 3;
  piVar1[1] = 4;
  Matrix<int>::Matrix(&c,&m);
  Matrix<int>::operator+(&s,&m);
  Matrix<int>::operator+(&s2,&c);
  testing::internal::CmpHelperEQ<Matrix<int>,Matrix<int>>((internal *)&gtest_ar,"s2","s",&s2,&s);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_68.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)s.n;
  local_60.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"s.get_rows()","2",(unsigned_long *)&local_68,(int *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)s.m;
    local_60.data_._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar,"s.get_columns()","3",(unsigned_long *)&local_68,
               (int *)&local_60);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_68.ptr_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"s[0][0]","2",*s.M,(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x32,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_68.ptr_._0_4_ = 4;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"s[0][1]","4",*s.M + 1,(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x33,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_68.ptr_._0_4_ = 6;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"s[1][0]","6",s.M[1],(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x34,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_68.ptr_._0_4_ = 8;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"s[1][1]","8",s.M[1] + 1,(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x35,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_68.ptr_ = local_68.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"s[0][2]","0",*s.M + 2,(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x36,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_68.ptr_ = local_68.ptr_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"s[1][2]","0",s.M[1] + 2,(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
                   ,0x37,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      goto LAB_00108e33;
    }
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/BMSTU-2019-LAB[P]02-lab-04-templates-matrix-AntonGrigorev/tests/matrix_unittests.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_68);
LAB_00108e33:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Matrix<int>::~Matrix(&s2);
  Matrix<int>::~Matrix(&s);
  Matrix<int>::~Matrix(&c);
  Matrix<int>::~Matrix(&m);
  return;
}

Assistant:

TEST(Matrix, Add) {
  Matrix<int> m(2, 3);
  m[0][0] = 1;
  m[0][1] = 2;
  m[1][0] = 3;
  m[1][1] = 4;

  Matrix<int> c = m;

  Matrix<int> s = m + c;
  Matrix<int> s2 = c + c;
  EXPECT_EQ(s2, s);

  ASSERT_EQ(s.get_rows(), 2);
  ASSERT_EQ(s.get_columns(), 3);
  EXPECT_EQ(s[0][0], 2);
  EXPECT_EQ(s[0][1], 4);
  EXPECT_EQ(s[1][0], 6);
  EXPECT_EQ(s[1][1], 8);
  EXPECT_EQ(s[0][2], 0);
  EXPECT_EQ(s[1][2], 0);
}